

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O3

_Bool iter_linear_next(hdr_iter *iter)

{
  int64_t *piVar1;
  long lVar2;
  hdr_histogram *phVar3;
  _Bool _Var4;
  ulong uVar5;
  byte bVar6;
  ulong uVar7;
  
  (iter->specifics).percentiles.percentile_to_iterate_to = 0.0;
  lVar2 = (iter->specifics).linear.next_value_reporting_level_lowest_equivalent;
  if ((iter->total_count <= iter->cumulative_count) &&
     (_Var4 = next_value_greater_than_reporting_level_upper_bound
                        ((hdr_iter *)iter->h,(ulong)(uint)iter->counts_index), !_Var4)) {
    return false;
  }
  if (iter->value < lVar2) {
    do {
      _Var4 = move_next(iter);
      if (!_Var4) {
        return true;
      }
      lVar2 = iter->value;
      piVar1 = &(iter->specifics).linear.count_added_in_this_iteration_step;
      *piVar1 = *piVar1 + iter->count;
    } while (lVar2 < (iter->specifics).linear.next_value_reporting_level_lowest_equivalent);
  }
  lVar2 = (iter->specifics).linear.next_value_reporting_level;
  phVar3 = iter->h;
  iter->value_iterated_from = iter->value_iterated_to;
  iter->value_iterated_to = lVar2;
  uVar5 = lVar2 + (iter->specifics).linear.value_units_per_bucket;
  (iter->specifics).linear.next_value_reporting_level = uVar5;
  uVar7 = phVar3->sub_bucket_mask | uVar5;
  lVar2 = 0x3f;
  if (uVar7 != 0) {
    for (; uVar7 >> lVar2 == 0; lVar2 = lVar2 + -1) {
    }
  }
  bVar6 = 0x3f - (((byte)lVar2 ^ 0x3f) + (char)phVar3->sub_bucket_half_count_magnitude);
  (iter->specifics).linear.next_value_reporting_level_lowest_equivalent =
       (long)(int)((long)uVar5 >> (bVar6 & 0x3f)) << (bVar6 & 0x3f);
  return true;
}

Assistant:

static bool iter_linear_next(struct hdr_iter* iter)
{
    struct hdr_iter_linear* linear = &iter->specifics.linear;

    linear->count_added_in_this_iteration_step = 0;

    if (has_next(iter) ||
        next_value_greater_than_reporting_level_upper_bound(
            iter, linear->next_value_reporting_level_lowest_equivalent))
    {
        do
        {
            if (iter->value >= linear->next_value_reporting_level_lowest_equivalent)
            {
                update_iterated_values(iter, linear->next_value_reporting_level);

                linear->next_value_reporting_level += linear->value_units_per_bucket;
                linear->next_value_reporting_level_lowest_equivalent =
                    lowest_equivalent_value(iter->h, linear->next_value_reporting_level);

                return true;
            }

            if (!move_next(iter))
            {
                return true;
            }

            linear->count_added_in_this_iteration_step += iter->count;
        }
        while (true);
    }

    return false;
}